

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void YM2608IRQMaskWrite(FM_OPN *OPN,YM2608 *F2608,int v)

{
  int v_local;
  YM2608 *F2608_local;
  FM_OPN *OPN_local;
  
  if ((v & 0x80U) == 0) {
    OPN->type = OPN->type & 0xfb;
  }
  else {
    OPN->type = OPN->type | 4;
  }
  F2608->irqmask = (byte)v & 0x1f;
  FM_IRQMASK_SET(&OPN->ST,(uint)(F2608->irqmask & F2608->flagmask));
  return;
}

Assistant:

INLINE void YM2608IRQMaskWrite(FM_OPN *OPN, YM2608 *F2608, int v)
{
	/* SCH,xx,xxx,EN_ZERO,EN_BRDY,EN_EOS,EN_TB,EN_TA */

	/* extend 3ch. enable/disable */
	if(v&0x80)
		OPN->type |= TYPE_6CH;  /* OPNA mode - 6 FM channels */
	else
		OPN->type &= ~TYPE_6CH; /* OPN mode - 3 FM channels */

	/* IRQ MASK store and set */
	F2608->irqmask = v&0x1f;
	FM_IRQMASK_SET(&OPN->ST, (F2608->irqmask & F2608->flagmask) );
}